

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandEcho(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int n;
  int c;
  int i;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = true;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"hn");
    if (iVar2 == -1) {
      if (pAbc->Out == _stdout) {
        for (n = globalUtilOptind; n < argc; n = n + 1) {
          Abc_Print(1,"%s ",argv[n]);
        }
        if (bVar1) {
          Abc_Print(1,"\n");
        }
      }
      else {
        for (n = globalUtilOptind; n < argc; n = n + 1) {
          fprintf((FILE *)pAbc->Out,"%s ",argv[n]);
        }
        if (bVar1) {
          fprintf((FILE *)pAbc->Out,"\n");
        }
        fflush((FILE *)pAbc->Out);
      }
      return 0;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x6e)) break;
    bVar1 = false;
  }
  fprintf((FILE *)pAbc->Err,"usage: echo [-h] string \n");
  fprintf((FILE *)pAbc->Err,"   -n \t\tsuppress newline at the end\n");
  fprintf((FILE *)pAbc->Err,"   -h \t\tprint the command usage\n");
  return 1;
}

Assistant:

int CmdCommandEcho( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int i;
    int c;
    int n = 1;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "hn" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            n = 0;
            break;
        case 'h':
            goto usage;
            break;
        default:
            goto usage;
        }
    }

    if (pAbc->Out == stdout){
        for ( i = globalUtilOptind; i < argc; i++ )
            Abc_Print( 1, "%s ", argv[i] );
        if ( n )
            Abc_Print( 1, "\n" );

    }else{
        for ( i = globalUtilOptind; i < argc; i++ )
            fprintf( pAbc->Out, "%s ", argv[i] );
        if ( n )
            fprintf( pAbc->Out, "\n" );

        fflush ( pAbc->Out );
    }
    return 0;

  usage:
    fprintf( pAbc->Err, "usage: echo [-h] string \n" );
    fprintf( pAbc->Err, "   -n \t\tsuppress newline at the end\n" );
    fprintf( pAbc->Err, "   -h \t\tprint the command usage\n" );
    return ( 1 );
}